

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

DLword * extendstack(void)

{
  DLword *pDVar1;
  ushort uVar2;
  LispPTR *pLVar3;
  ushort StackOffset;
  
  uVar2 = InterfacePage->endofstack;
  if (uVar2 < (ushort)*LastStackAddr_word) {
    if (((uint)(ushort)*GuardStackAddr_word < (uint)uVar2) && (*STACKOVERFLOW_word == 0)) {
      extended_frame = 1;
      pLVar3 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
      *(byte *)((long)pLVar3 + 3) = *(byte *)((long)pLVar3 + 3) | 4;
      *PENDINGINTERRUPT_word = 0x4c;
      *STACKOVERFLOW_word = 0x4c;
    }
    newpage(uVar2 + 2 | 0x10000);
    pDVar1 = Stackspace + (uVar2 + 2 & 0xffff);
    pDVar1[0] = 0xfe;
    pDVar1[1] = 0xa000;
    StackOffset = uVar2 + 0x100;
    InterfacePage->endofstack = StackOffset;
    pDVar1 = Stackspace + StackOffset;
    pDVar1[0] = 2;
    pDVar1[1] = 0xe000;
    pDVar1 = Stackspace + (uint)uVar2;
    pDVar1[0] = 2;
    pDVar1[1] = 0xa000;
    pLVar3 = NativeAligned4FromStackOffset(StackOffset);
    return (DLword *)pLVar3;
  }
  return (DLword *)0x0;
}

Assistant:

static DLword *extendstack(void) {
  LispPTR easp;
  LispPTR scanptr;

  easp = InterfacePage->endofstack;

  if (easp < LOLOC(*LastStackAddr_word)) {
    if ((easp > LOLOC(*GuardStackAddr_word)) && ((*STACKOVERFLOW_word) == NIL)) {
      extended_frame = 1;
      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->stackoverflow = 1;
      *STACKOVERFLOW_word = *PENDINGINTERRUPT_word = ATOM_T;
    }
    newpage(STK_OFFSET | (scanptr = easp + 2));
    /* I don't concern about DOLOCKPAGES */

    MAKEFREEBLOCK(NativeAligned2FromStackOffset(scanptr), DLWORDSPER_PAGE - 2);
    InterfacePage->endofstack = scanptr = easp + DLWORDSPER_PAGE;
    SETUPGUARDBLOCK(NativeAligned2FromStackOffset(InterfacePage->endofstack), 2);
    MAKEFREEBLOCK(NativeAligned2FromStackOffset(easp), 2);
    return ((DLword *)NativeAligned4FromStackOffset(scanptr));
  } else
    return (NIL);
}